

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void canvas_saveto(_glist *x,_binbuf *b)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  _binbuf *x_00;
  t_atom *argv;
  t_symbol *ptVar8;
  t_symbol *ptVar9;
  _outconnect *p_Var10;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 uVar12;
  undefined8 uVar11;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar13;
  t_symbol *local_f8;
  int sinkno;
  int srcno;
  t_symbol *patchsym;
  _binbuf *bz;
  _outconnect *oc;
  t_linetraverser t;
  t_gobj *y;
  _binbuf *b_local;
  _glist *x_local;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if ((x->gl_owner == (_glist *)0x0) || (x->gl_env != (_canvasenvironment *)0x0)) {
    ptVar8 = gensym("#N");
    ptVar9 = gensym("canvas");
    uVar11 = CONCAT44(uVar12,x->gl_screenx2 - x->gl_screenx1);
    binbuf_addv(b,"ssiiiii;",ptVar8,ptVar9,(ulong)(uint)x->gl_screenx1,(ulong)(uint)x->gl_screeny1,
                uVar11,x->gl_screeny2 - x->gl_screeny1,CONCAT44(uVar13,x->gl_font));
    canvas_savedeclarationsto(x,b);
  }
  else {
    x_00 = binbuf_new();
    binbuf_addbinbuf(x_00,(x->gl_obj).te_binbuf);
    iVar6 = binbuf_getnatom(x_00);
    argv = binbuf_getvec(x_00);
    local_f8 = atom_getsymbolarg(1,iVar6,argv);
    binbuf_free(x_00);
    ptVar8 = gensym("#N");
    ptVar9 = gensym("canvas");
    uVar7 = x->gl_screenx1;
    uVar1 = x->gl_screeny1;
    iVar6 = x->gl_screenx2;
    iVar2 = x->gl_screenx1;
    iVar3 = x->gl_screeny2;
    iVar4 = x->gl_screeny1;
    if (local_f8 == &s_) {
      local_f8 = gensym("(subpatch)");
    }
    uVar11 = CONCAT44(uVar12,iVar6 - iVar2);
    binbuf_addv(b,"ssiiiisi;",ptVar8,ptVar9,(ulong)uVar7,(ulong)uVar1,uVar11,iVar3 - iVar4,local_f8,
                (uint)(*(ushort *)&x->field_0xe8 >> 1 & 1));
  }
  for (t._112_8_ = x->gl_list; t._112_8_ != 0; t._112_8_ = *(undefined8 *)(t._112_8_ + 8)) {
    gobj_save((t_gobj *)t._112_8_,b);
  }
  linetraverser_start((t_linetraverser *)&oc,x);
  while( true ) {
    uVar12 = (undefined4)((ulong)uVar11 >> 0x20);
    p_Var10 = linetraverser_next((t_linetraverser *)&oc);
    if (p_Var10 == (_outconnect *)0x0) break;
    uVar7 = canvas_getindex(x,(t_gobj *)t.tr_x);
    iVar6 = canvas_getindex(x,(t_gobj *)t._16_8_);
    ptVar8 = gensym("#X");
    ptVar9 = gensym("connect");
    uVar11 = CONCAT44(uVar12,iVar6);
    binbuf_addv(b,"ssiiii;",ptVar8,ptVar9,(ulong)uVar7,(ulong)t.tr_ob._4_4_,uVar11,t.tr_inlet._4_4_)
    ;
  }
  if ((((((((*(ushort *)&x->field_0xe8 >> 8 & 1) != 0) || (x->gl_x1 != 0.0)) || (NAN(x->gl_x1))) ||
        ((x->gl_y1 != 0.0 || (NAN(x->gl_y1))))) ||
       ((x->gl_x2 != 1.0 || ((NAN(x->gl_x2) || (x->gl_y2 != 1.0)))))) || (NAN(x->gl_y2))) ||
     ((x->gl_pixwidth != 0 || (x->gl_pixheight != 0)))) {
    if (((*(ushort *)&x->field_0xe8 >> 8 & 1) == 0) || ((*(ushort *)&x->field_0xe8 >> 7 & 1) == 0))
    {
      ptVar8 = gensym("#X");
      ptVar9 = gensym("coords");
      binbuf_addv(b,"ssfffffff;",(double)x->gl_x1,(double)x->gl_y1,(double)x->gl_x2,(double)x->gl_y2
                  ,(double)x->gl_pixwidth,(double)x->gl_pixheight,
                  (double)(*(ushort *)&x->field_0xe8 >> 8 & 1),ptVar8,ptVar9);
    }
    else {
      ptVar8 = gensym("#X");
      ptVar9 = gensym("coords");
      fVar5 = 2.0;
      if ((*(ushort *)&x->field_0xe8 >> 9 & 1) == 0) {
        fVar5 = 1.0;
      }
      binbuf_addv(b,"ssfffffffff;",(double)x->gl_x1,(double)x->gl_y1,(double)x->gl_x2,
                  (double)x->gl_y2,(double)x->gl_pixwidth,(double)x->gl_pixheight,(double)fVar5,
                  (double)x->gl_xmargin,ptVar8,ptVar9);
    }
  }
  return;
}

Assistant:

static void canvas_saveto(t_canvas *x, t_binbuf *b)
{
    t_gobj *y;
    t_linetraverser t;
    t_outconnect *oc;

        /* subpatch */
    if (x->gl_owner && !x->gl_env)
    {
        /* have to go to original binbuf to find out how we were named. */
        t_binbuf *bz = binbuf_new();
        t_symbol *patchsym;
        binbuf_addbinbuf(bz, x->gl_obj.ob_binbuf);
        patchsym = atom_getsymbolarg(1, binbuf_getnatom(bz), binbuf_getvec(bz));
        binbuf_free(bz);
        binbuf_addv(b, "ssiiiisi;", gensym("#N"), gensym("canvas"),
            (int)(x->gl_screenx1),
            (int)(x->gl_screeny1),
            (int)(x->gl_screenx2 - x->gl_screenx1),
            (int)(x->gl_screeny2 - x->gl_screeny1),
            (patchsym != &s_ ? patchsym: gensym("(subpatch)")),
            x->gl_mapped);
    }
        /* root or abstraction */
    else
    {
        binbuf_addv(b, "ssiiiii;", gensym("#N"), gensym("canvas"),
            (int)(x->gl_screenx1),
            (int)(x->gl_screeny1),
            (int)(x->gl_screenx2 - x->gl_screenx1),
            (int)(x->gl_screeny2 - x->gl_screeny1),
                (int)x->gl_font);
        canvas_savedeclarationsto(x, b);
    }
    for (y = x->gl_list; y; y = y->g_next)
        gobj_save(y, b);

    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        int srcno = canvas_getindex(x, &t.tr_ob->ob_g);
        int sinkno = canvas_getindex(x, &t.tr_ob2->ob_g);
        binbuf_addv(b, "ssiiii;", gensym("#X"), gensym("connect"),
            srcno, t.tr_outno, sinkno, t.tr_inno);
    }
        /* unless everything is the default (as in ordinary subpatches)
        print out a "coords" message to set up the coordinate systems */
    if (x->gl_isgraph || x->gl_x1 || x->gl_y1 ||
        x->gl_x2 != 1 ||  x->gl_y2 != 1 || x->gl_pixwidth || x->gl_pixheight)
    {
        if (x->gl_isgraph && x->gl_goprect)
                /* if we have a graph-on-parent rectangle, we're new style.
                The format is arranged so
                that old versions of Pd can at least do something with it. */
            binbuf_addv(b, "ssfffffffff;", gensym("#X"), gensym("coords"),
                x->gl_x1, x->gl_y1,
                x->gl_x2, x->gl_y2,
                (t_float)x->gl_pixwidth, (t_float)x->gl_pixheight,
                (t_float)((x->gl_hidetext)?2.:1.),
                (t_float)x->gl_xmargin, (t_float)x->gl_ymargin);
                    /* otherwise write in 0.38-compatible form */
        else binbuf_addv(b, "ssfffffff;", gensym("#X"), gensym("coords"),
                x->gl_x1, x->gl_y1,
                x->gl_x2, x->gl_y2,
                (t_float)x->gl_pixwidth, (t_float)x->gl_pixheight,
                (t_float)x->gl_isgraph);
    }
}